

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csv::get_col_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,csv *this,string_view filename,CSVFormat *format)

{
  _Alloc_hider _Var1;
  CSVGuessResult CVar2;
  CSVFormat *this_00;
  CSVFormat *this_01;
  internals *this_02;
  string_view head_00;
  string_view filename_00;
  string head;
  vector<char,_std::allocator<char>_> local_b0;
  string local_98;
  vector<char,_std::allocator<char>_> local_78;
  vector<char,_std::allocator<char>_> local_60;
  int local_48;
  undefined2 local_44;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  VariableColumnPolicy local_28;
  
  this_01 = (CSVFormat *)filename._M_str;
  internals::get_csv_head_abi_cxx11_(&local_98,(internals *)this,filename);
  if (1 < (ulong)((long)(this_01->possible_delimiters).
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this_01->possible_delimiters).
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_b0,(vector<char,_std::allocator<char>_> *)this_01);
    filename_00._M_str = (char *)filename._M_len;
    filename_00._M_len = (size_t)this;
    CVar2 = guess_format(filename_00,&local_b0);
    if (local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    this_00 = CSVFormat::delimiter(this_01,CVar2.delim);
    CSVFormat::header_row(this_00,CVar2.header_row);
  }
  _Var1._M_p = local_98._M_dataplus._M_p;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_78,(vector<char,_std::allocator<char>_> *)this_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_60,&this_01->trim_chars);
  local_44._0_1_ = this_01->no_quote;
  local_44._1_1_ = this_01->quote_char;
  local_48 = this_01->header;
  this_02 = (internals *)&this_01->col_names;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_02);
  local_28 = this_01->variable_column_policy;
  head_00._M_str = (char *)&local_78;
  head_00._M_len = (size_t)_Var1._M_p;
  internals::_get_col_names_abi_cxx11_(__return_storage_ptr__,this_02,head_00,format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<std::string> get_col_names(csv::string_view filename, CSVFormat format) {
        auto head = internals::get_csv_head(filename);

        /** Guess delimiter and header row */
        if (format.guess_delim()) {
            auto guess_result = guess_format(filename, format.get_possible_delims());
            format.delimiter(guess_result.delim).header_row(guess_result.header_row);
        }

        return internals::_get_col_names(head, format);
    }